

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkMemUtil.cpp
# Opt level: O1

void __thiscall
vk::anon_unknown_6::HostPtr::HostPtr
          (HostPtr *this,DeviceInterface *vkd,VkDevice device,VkDeviceMemory memory,
          VkDeviceSize offset,VkDeviceSize size,VkMemoryMapFlags flags)

{
  VkResult result;
  TestError *this_00;
  void *local_18;
  
  this->m_vkd = vkd;
  this->m_device = device;
  (this->m_memory).m_internal = memory.m_internal;
  local_18 = (void *)0x0;
  result = (*vkd->_vptr_DeviceInterface[7])(vkd,device,memory.m_internal,0,offset,0,&local_18);
  checkResult(result,"vkd.mapMemory(device, mem, offset, size, flags, &hostPtr)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkMemUtil.cpp"
              ,0x3c);
  if (local_18 != (void *)0x0) {
    this->m_ptr = local_18;
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"hostPtr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkMemUtil.cpp"
             ,0x3d);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

HostPtr::HostPtr (const DeviceInterface& vkd, VkDevice device, VkDeviceMemory memory, VkDeviceSize offset, VkDeviceSize size, VkMemoryMapFlags flags)
	: m_vkd		(vkd)
	, m_device	(device)
	, m_memory	(memory)
	, m_ptr		(mapMemory(vkd, device, memory, offset, size, flags))
{
}